

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash.c
# Opt level: O2

PCryptoHash * p_crypto_hash_new(PCryptoHashType type)

{
  puint pVar1;
  _func_ppointer *p_Var2;
  _func_void_void_ptr_puchar_ptr_psize *p_Var3;
  _func_void_void_ptr *p_Var4;
  _func_puchar_ptr_void_ptr *p_Var5;
  _func_void_void_ptr *p_Var6;
  _func_void_void_ptr *p_Var7;
  PCryptoHash *mem;
  ulong uVar8;
  ppointer pvVar9;
  
  if (type < (P_CRYPTO_HASH_TYPE_GOST|P_CRYPTO_HASH_TYPE_SHA1)) {
    mem = (PCryptoHash *)p_malloc0(0x48);
    if (mem == (PCryptoHash *)0x0) {
      printf("** Error: %s **\n","PCryptoHash::p_crypto_hash_new: failed to allocate memory");
      return (PCryptoHash *)0x0;
    }
    uVar8 = (ulong)type;
    p_Var2 = (_func_ppointer *)(&PTR_p_crypto_hash_md5_new_0011ebe8)[uVar8];
    p_Var3 = (_func_void_void_ptr_puchar_ptr_psize *)(&PTR_p_crypto_hash_md5_update_0011ec40)[uVar8]
    ;
    p_Var4 = (_func_void_void_ptr *)(&PTR_p_crypto_hash_md5_finish_0011ec98)[uVar8];
    p_Var5 = (_func_puchar_ptr_void_ptr *)(&PTR_p_crypto_hash_md5_digest_0011ecf0)[uVar8];
    p_Var6 = (_func_void_void_ptr *)(&PTR_p_crypto_hash_md5_reset_0011ed48)[uVar8];
    p_Var7 = (_func_void_void_ptr *)(&PTR_p_crypto_hash_md5_free_0011eda0)[uVar8];
    pVar1 = *(puint *)(&DAT_00117064 + uVar8 * 4);
    mem->create = p_Var2;
    mem->update = p_Var3;
    mem->finish = p_Var4;
    mem->digest = p_Var5;
    mem->reset = p_Var6;
    mem->free = p_Var7;
    mem->hash_len = pVar1;
    mem->type = type;
    mem->closed = 0;
    pvVar9 = (*p_Var2)();
    mem->context = pvVar9;
    if (pvVar9 != (ppointer)0x0) {
      return mem;
    }
    p_free(mem);
  }
  return (PCryptoHash *)0x0;
}

Assistant:

P_LIB_API PCryptoHash *
p_crypto_hash_new (PCryptoHashType type)
{
	PCryptoHash *ret;

	if (P_UNLIKELY (!((int) type >= (int) P_CRYPTO_HASH_TYPE_MD5 &&
			  (int) type <= (int) P_CRYPTO_HASH_TYPE_GOST)))
		return NULL;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PCryptoHash))) == NULL)) {
		P_ERROR ("PCryptoHash::p_crypto_hash_new: failed to allocate memory");
		return NULL;
	}

	switch (type) {
	case P_CRYPTO_HASH_TYPE_MD5:
		P_HASH_FUNCS (ret, md5)
		ret->hash_len = 16;
		break;
	case P_CRYPTO_HASH_TYPE_SHA1:
		P_HASH_FUNCS (ret, sha1)
		ret->hash_len = 20;
		break;
	case P_CRYPTO_HASH_TYPE_SHA2_224:
		P_HASH_FUNCS (ret, sha2_224)
		ret->hash_len = 28;
		break;
	case P_CRYPTO_HASH_TYPE_SHA2_256:
		P_HASH_FUNCS (ret, sha2_256)
		ret->hash_len = 32;
		break;
	case P_CRYPTO_HASH_TYPE_SHA2_384:
		P_HASH_FUNCS (ret, sha2_384)
		ret->hash_len = 48;
		break;
	case P_CRYPTO_HASH_TYPE_SHA2_512:
		P_HASH_FUNCS (ret, sha2_512)
		ret->hash_len = 64;
		break;
	case P_CRYPTO_HASH_TYPE_SHA3_224:
		P_HASH_FUNCS (ret, sha3_224)
		ret->hash_len = 28;
		break;
	case P_CRYPTO_HASH_TYPE_SHA3_256:
		P_HASH_FUNCS (ret, sha3_256)
		ret->hash_len = 32;
		break;
	case P_CRYPTO_HASH_TYPE_SHA3_384:
		P_HASH_FUNCS (ret, sha3_384)
		ret->hash_len = 48;
		break;
	case P_CRYPTO_HASH_TYPE_SHA3_512:
		P_HASH_FUNCS (ret, sha3_512)
		ret->hash_len = 64;
		break;
	case P_CRYPTO_HASH_TYPE_GOST:
		P_HASH_FUNCS (ret, gost3411)
		ret->hash_len = 32;
		break;
	}

	ret->type   = type;
	ret->closed = FALSE;

	if (P_UNLIKELY ((ret->context = ret->create ()) == NULL)) {
		p_free (ret);
		return NULL;
	}

	return ret;
}